

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nmq.c
# Opt level: O1

void flush(NMQ *q)

{
  dlist *list;
  char cVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  dlist_s *pdVar4;
  segment *psVar5;
  bool bVar6;
  bool bVar7;
  int8_t iVar8;
  uint uVar9;
  int iVar10;
  uint32_t uVar11;
  char *pcVar12;
  segment *psVar13;
  int64_t iVar15;
  int iVar16;
  uint32_t *puVar17;
  uint uVar18;
  dlist_s *node;
  long lVar19;
  uint uVar20;
  uint uVar21;
  segment *s;
  char buf [24];
  segment seg;
  int local_6bc;
  char local_698 [32];
  segment local_678 [25];
  ulong uVar14;
  
  if ((q->probe_pending != '\0') && (q->ts_probe_wait <= q->current)) {
    local_678[0].resendts = 0;
    local_678[0].n_sent = 0;
    local_678[0].rto = 0;
    local_678[0].dupacks = 0;
    local_678[0]._30_2_ = 0;
    local_678[0].head.prev = (dlist_s *)0x0;
    local_678[0].head.next = (dlist_s *)0x0;
    local_678[0].len = 0;
    local_678[0].data[0] = '\0';
    local_678[0]._61_3_ = 0;
    local_678[0].cmd = 3;
    local_678[0].conv = q->conv;
    local_678[0]._37_3_ = 0;
    local_678[0].sendts = 0;
    local_678[0].una = q->rcv_nxt;
    local_678[0]._40_8_ = (ulong)(ushort)((short)q->MAX_RCV_BUF_NUM - (short)q->nrcv_buf) << 0x30;
    local_698[0] = '\0';
    local_698[1] = '\0';
    local_698[2] = '\0';
    local_698[3] = '\0';
    local_698[4] = '\0';
    local_698[5] = '\0';
    local_698[6] = '\0';
    local_698[7] = '\0';
    local_698[8] = '\0';
    local_698[9] = '\0';
    local_698[10] = '\0';
    local_698[0xb] = '\0';
    local_698[0xc] = '\0';
    local_698[0xd] = '\0';
    local_698[0xe] = '\0';
    local_698[0xf] = '\0';
    local_698[0x10] = '\0';
    local_698[0x11] = '\0';
    local_698[0x12] = '\0';
    local_698[0x13] = '\0';
    local_698[0x14] = '\0';
    local_698[0x15] = '\0';
    local_698[0x16] = '\0';
    local_698[0x17] = '\0';
    pcVar12 = encode_seg_and_data(local_678,local_698);
    nmq_output(q,local_698,(int)pcVar12 - (int)local_698);
    q->probe_pending = '\0';
    q->ts_probe_wait = 0;
  }
  uVar14 = (ulong)q->ackcount;
  if (uVar14 == 0) {
    if (q->ack_failures != 0) {
      local_678[0].resendts = 0;
      local_678[0].n_sent = 0;
      local_678[0].rto = 0;
      local_678[0].dupacks = 0;
      local_678[0]._30_2_ = 0;
      local_678[0].head.prev = (dlist_s *)0x0;
      local_678[0].head.next = (dlist_s *)0x0;
      local_678[0].len = 0;
      local_678[0].data[0] = '\0';
      local_678[0]._61_3_ = 0;
      local_678[0].cmd = 4;
      local_678[0].conv = q->conv;
      local_678[0]._37_3_ = 0;
      local_678[0].sendts = 0;
      local_678[0].una = q->rcv_nxt;
      local_678[0]._40_8_ = (ulong)(ushort)((short)q->MAX_RCV_BUF_NUM - (short)q->nrcv_buf) << 0x30;
      local_698[0] = '\0';
      local_698[1] = '\0';
      local_698[2] = '\0';
      local_698[3] = '\0';
      local_698[4] = '\0';
      local_698[5] = '\0';
      local_698[6] = '\0';
      local_698[7] = '\0';
      local_698[8] = '\0';
      local_698[9] = '\0';
      local_698[10] = '\0';
      local_698[0xb] = '\0';
      local_698[0xc] = '\0';
      local_698[0xd] = '\0';
      local_698[0xe] = '\0';
      local_698[0xf] = '\0';
      local_698[0x10] = '\0';
      local_698[0x11] = '\0';
      local_698[0x12] = '\0';
      local_698[0x13] = '\0';
      local_698[0x14] = '\0';
      local_698[0x15] = '\0';
      local_698[0x16] = '\0';
      local_698[0x17] = '\0';
      pcVar12 = encode_seg_and_data(local_678,local_698);
      nmq_output(q,local_698,(int)pcVar12 - (int)local_698);
      q->probe_pending = '\0';
      q->ts_probe_wait = 0;
    }
    q->ack_failures = 0;
  }
  else {
    uVar20 = q->MSS;
    lVar19 = 0;
    do {
      decode_uint32((uint32_t *)local_678,(char *)((long)q->acklist + lVar19));
      lVar19 = lVar19 + 8;
    } while (uVar14 << 3 != lVar19);
    uVar9 = uVar20 >> 3;
    psVar13 = obtain_segment(&q->pool);
    psVar13->sn = 0;
    psVar13->conv = q->conv;
    psVar13->cmd = '\x02';
    psVar13->una = q->rcv_nxt;
    psVar13->len = 0;
    psVar13->wnd = (short)q->MAX_RCV_BUF_NUM - (short)q->nrcv_buf;
    psVar13->frag = '\0';
    psVar13->sendts = 0;
    puVar17 = q->acklist;
    memset(local_678,0,0x640);
    uVar20 = uVar20 & 0xfffffff8;
    do {
      uVar18 = (uint)uVar14;
      uVar21 = uVar18 - uVar9;
      if (uVar18 < uVar9 || uVar21 == 0) {
        psVar13->len = uVar18 << 3;
        memcpy(psVar13->data,puVar17,(ulong)(uVar18 << 3));
        uVar21 = 0;
      }
      else {
        psVar13->len = uVar20;
        memcpy(psVar13->data,puVar17,(ulong)uVar20);
      }
      puVar17 = (uint32_t *)((long)puVar17 + (ulong)psVar13->len);
      pcVar12 = encode_seg_and_data(psVar13,(char *)local_678);
      nmq_output(q,(char *)local_678,(int)pcVar12 - (int)local_678);
      uVar14 = (ulong)uVar21;
    } while (uVar21 != 0);
    recycle_segment(&q->pool,psVar13);
    q->ackcount = 0;
    q->ack_failures = 0;
  }
  uVar14 = MIN((ulong)q->MAX_SND_BUF_NUM,(ulong)q->rmt_wnd);
  iVar10 = (int)uVar14;
  if (q->fc_on != '\0') {
    iVar15 = MIN(uVar14 & 0xffffffff,(ulong)(q->fc).cwnd);
    iVar10 = (int)iVar15;
  }
  list = &q->snd_que;
  node = (q->snd_que).next;
  if (node != list) {
    do {
      uVar20 = q->snd_nxt;
      if (q->snd_una + iVar10 <= uVar20) break;
      pdVar4 = node->next;
      q->snd_nxt = uVar20 + 1;
      *(uint *)&node[2].next = uVar20;
      dlist_remove_node(node);
      dlist_add_tail(&q->snd_buf,node);
      q->snd_sn_to_node
      [(ulong)(*(int *)&node[2].next + q->MAX_SND_BUF_NUM) % (ulong)q->MAX_SND_BUF_NUM] = node;
      q->nsnd_que = q->nsnd_que - 1;
      node = pdVar4;
    } while (pdVar4 != list);
  }
  uVar20 = q->current;
  uVar11 = q->MAX_RCV_BUF_NUM;
  uVar2 = q->nrcv_buf;
  cVar1 = (q->fc).DUP_ACK_LIM;
  psVar13 = local_678;
  iVar10 = 0;
  memset(psVar13,0,0x640);
  uVar3 = 0;
  uVar9 = 0;
  local_6bc = 0;
  s = (segment *)(q->snd_buf).next;
  do {
    if (s == (segment *)&q->snd_buf) break;
    if (s->n_sent == 0) {
      s->rto = q->rto;
LAB_001016fa:
      bVar7 = false;
    }
    else {
      if (s->resendts <= uVar20) {
        uVar3 = s->sn;
        iVar16 = (q->rto >> (q->nodelay != '\0')) + s->rto;
        s->rto = iVar16;
        if (60000 < iVar16) {
          s->rto = 60000;
        }
        iVar10 = iVar10 + 1;
LAB_001016f4:
        s->dupacks = 0;
        goto LAB_001016fa;
      }
      bVar7 = true;
      if ((int)cVar1 <= (int)(uint)s->dupacks) {
        uVar3 = s->sn;
        s->rto = 200;
        local_6bc = local_6bc + 1;
        goto LAB_001016f4;
      }
    }
    psVar5 = (segment *)(s->head).next;
    bVar6 = true;
    if (!bVar7) {
      if ((q->steady_on == '\0') || (uVar9 = uVar9 + s->len + 0x18, uVar9 <= q->BYTES_PER_FLUSH)) {
        s->n_sent = s->n_sent + 1;
        s->wnd = (short)uVar11 - (short)uVar2;
        s->una = q->rcv_nxt;
        s->sendts = uVar20;
        s->resendts = s->rto + uVar20;
        lVar19 = (long)psVar13 - (long)local_678;
        if ((long)(ulong)q->MSS <= (long)((ulong)s->len + lVar19)) {
          psVar13 = local_678;
          nmq_output(q,(char *)psVar13,(int)lVar19);
        }
        puVar17 = &(q->stat).bytes_send_tot;
        *puVar17 = *puVar17 + s->len;
        psVar13 = (segment *)encode_seg_and_data(s,(char *)psVar13);
        if (((q->MAX_PKT_TRY < s->n_sent) && (q->state == -1)) &&
           (q->failure_cb != (_func_void_nmq_s_ptr_uint32_t *)0x0)) {
          (*q->failure_cb)(q,s->sn);
        }
      }
      else {
        bVar6 = false;
      }
    }
    s = psVar5;
  } while (bVar6);
  if (local_678 < psVar13) {
    nmq_output(q,(char *)local_678,(int)psVar13 - (int)local_678);
  }
  if (((iVar10 + local_6bc != 0) && ((q->fc).in_trouble == '\0')) &&
     ((uint)(q->fc).TROUBLE_TOLERANCE <= (uint)(iVar10 + local_6bc))) {
    (q->fc).in_trouble = '\x01';
    (q->fc).max_lost_sn = uVar3;
    iVar15 = MAX(2,(long)((float)(q->fc).cwnd * (q->fc).ssth_alpha));
    uVar11 = (uint32_t)iVar15;
    (q->fc).ssthresh = uVar11;
    (q->fc).cwnd = uVar11;
    if (local_6bc != 0) {
      (q->fc).cwnd = (int)(q->fc).DUP_ACK_LIM + uVar11;
    }
    (q->fc).incr = (float)((q->fc).MSS * (q->fc).cwnd);
  }
  rcvbuf2q(q);
  if ((q->rmt_wnd == 0) && (q->probe_pending == '\0')) {
    q->probe_pending = '\x01';
    q->ts_probe_wait = q->current + 500;
  }
  if (((q->fin_sn != '\0') && (iVar8 = list_not_empty(list), iVar8 == '\0')) &&
     (iVar8 = list_not_empty(&q->snd_buf), iVar8 == '\0')) {
    nmq_output(q,(char *)0x0,-1);
  }
  return;
}

Assistant:

static void flush(NMQ *q) {

    window_probe_req2peer_if_need(q);

    acks2peer(q);

    sndq2buf(q);

    flush_snd_buf(q);

    rcvbuf2q(q);

    window_probe_build_req_if_need(q);

    check_send_done(q);
}